

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

float * __thiscall cimg_library::CImg<float>::min_max<float>(CImg<float> *this,float *max_val)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  float *pfVar4;
  CImgInstanceException *this_00;
  float *ptrs;
  float *pfVar5;
  char *pcVar6;
  float fVar7;
  float fVar8;
  
  bVar3 = is_empty(this);
  if (!bVar3) {
    pfVar4 = this->_data;
    fVar7 = *pfVar4;
    pfVar1 = pfVar4 + (ulong)this->_spectrum * (ulong)this->_depth *
                      (ulong)this->_height * (ulong)this->_width;
    fVar8 = fVar7;
    for (pfVar5 = pfVar4; pfVar5 < pfVar1; pfVar5 = pfVar5 + 1) {
      fVar2 = *pfVar5;
      if (fVar2 < fVar8) {
        pfVar4 = pfVar5;
        fVar8 = fVar2;
      }
      if (fVar2 <= fVar7) {
        fVar2 = fVar7;
      }
      fVar7 = fVar2;
    }
    *max_val = fVar7;
    return pfVar4;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar6 = "non-";
  if (this->_is_shared != false) {
    pcVar6 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::min_max(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar6,"float");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

const T& min_max(t& max_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "min_max(): Empty instance.",
                                    cimg_instance);
      const T *ptr_min = _data;
      T min_value = *ptr_min, max_value = min_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val<min_value) { min_value = val; ptr_min = ptrs; }
        if (val>max_value) max_value = val;
      }
      max_val = (t)max_value;
      return *ptr_min;
    }